

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O0

void Kit_TruthCountOnesInCofs0(uint *pTruth,int nVars,int *pStore)

{
  int iVar1;
  int iVar2;
  uint local_2c;
  int Counter;
  int k;
  int i;
  int nWords;
  int *pStore_local;
  uint *puStack_10;
  int nVars_local;
  uint *pTruth_local;
  
  iVar1 = Kit_TruthWordNum(nVars);
  memset(pStore,0,(long)nVars << 2);
  if (nVars < 6) {
    if (0 < nVars) {
      iVar1 = Kit_WordCountOnes(*pTruth & 0x55555555);
      *pStore = iVar1;
    }
    if (1 < nVars) {
      iVar1 = Kit_WordCountOnes(*pTruth & 0x33333333);
      pStore[1] = iVar1;
    }
    if (2 < nVars) {
      iVar1 = Kit_WordCountOnes(*pTruth & 0xf0f0f0f);
      pStore[2] = iVar1;
    }
    if (3 < nVars) {
      iVar1 = Kit_WordCountOnes(*pTruth & 0xff00ff);
      pStore[3] = iVar1;
    }
    if (4 < nVars) {
      iVar1 = Kit_WordCountOnes(*pTruth & 0xffff);
      pStore[4] = iVar1;
    }
  }
  else {
    for (local_2c = 0; (int)local_2c < iVar1; local_2c = local_2c + 1) {
      iVar2 = Kit_WordCountOnes(pTruth[(int)local_2c]);
      for (Counter = 5; Counter < nVars; Counter = Counter + 1) {
        if ((local_2c & 1 << ((char)Counter - 5U & 0x1f)) == 0) {
          pStore[Counter] = iVar2 + pStore[Counter];
        }
      }
    }
    puStack_10 = pTruth;
    for (local_2c = 0; (int)local_2c < iVar1 / 2; local_2c = local_2c + 1) {
      iVar2 = Kit_WordCountOnes(*puStack_10 & 0x55555555 | (puStack_10[1] & 0x55555555) << 1);
      *pStore = iVar2 + *pStore;
      iVar2 = Kit_WordCountOnes(*puStack_10 & 0x33333333 | (puStack_10[1] & 0x33333333) << 2);
      pStore[1] = iVar2 + pStore[1];
      iVar2 = Kit_WordCountOnes(*puStack_10 & 0xf0f0f0f | (puStack_10[1] & 0xf0f0f0f) << 4);
      pStore[2] = iVar2 + pStore[2];
      iVar2 = Kit_WordCountOnes(*puStack_10 & 0xff00ff | (puStack_10[1] & 0xff00ff) << 8);
      pStore[3] = iVar2 + pStore[3];
      iVar2 = Kit_WordCountOnes(*puStack_10 & 0xffff | puStack_10[1] << 0x10);
      pStore[4] = iVar2 + pStore[4];
      puStack_10 = puStack_10 + 2;
    }
  }
  return;
}

Assistant:

void Kit_TruthCountOnesInCofs0( unsigned * pTruth, int nVars, int * pStore )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Counter;
    memset( pStore, 0, sizeof(int) * nVars );
    if ( nVars <= 5 )
    {
        if ( nVars > 0 )
            pStore[0] = Kit_WordCountOnes( pTruth[0] & 0x55555555 );
        if ( nVars > 1 )
            pStore[1] = Kit_WordCountOnes( pTruth[0] & 0x33333333 );
        if ( nVars > 2 )
            pStore[2] = Kit_WordCountOnes( pTruth[0] & 0x0F0F0F0F );
        if ( nVars > 3 )
            pStore[3] = Kit_WordCountOnes( pTruth[0] & 0x00FF00FF );
        if ( nVars > 4 )
            pStore[4] = Kit_WordCountOnes( pTruth[0] & 0x0000FFFF );
        return;
    }
    // nVars >= 6
    // count 1's for all other variables
    for ( k = 0; k < nWords; k++ )
    {
        Counter = Kit_WordCountOnes( pTruth[k] );
        for ( i = 5; i < nVars; i++ )
            if ( (k & (1 << (i-5))) == 0 )
                pStore[i] += Counter;
    }
    // count 1's for the first five variables
    for ( k = 0; k < nWords/2; k++ )
    {
        pStore[0] += Kit_WordCountOnes( (pTruth[0] & 0x55555555) | ((pTruth[1] & 0x55555555) <<  1) );
        pStore[1] += Kit_WordCountOnes( (pTruth[0] & 0x33333333) | ((pTruth[1] & 0x33333333) <<  2) );
        pStore[2] += Kit_WordCountOnes( (pTruth[0] & 0x0F0F0F0F) | ((pTruth[1] & 0x0F0F0F0F) <<  4) );
        pStore[3] += Kit_WordCountOnes( (pTruth[0] & 0x00FF00FF) | ((pTruth[1] & 0x00FF00FF) <<  8) );
        pStore[4] += Kit_WordCountOnes( (pTruth[0] & 0x0000FFFF) | ((pTruth[1] & 0x0000FFFF) << 16) );
        pTruth += 2;
    }
}